

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.hpp
# Opt level: O2

void __thiscall Encode::encodeFano(Encode *this)

{
  calcProbabilities(this);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(&this->m_matrix,
           (long)(this->m_probabilities).super__Vector_base<double,_std::allocator<double>_>._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(this->m_probabilities).super__Vector_base<double,_std::allocator<double>_>._M_impl
                 .super__Vector_impl_data._M_start >> 3);
  quickSortProbability
            (this,0,(int)((ulong)((long)(this->m_probabilities).
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_finish -
                                 (long)(this->m_probabilities).
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_start) >> 3) + -1);
  algorithmFano(this,0,(int)((ulong)((long)(this->m_probabilities).
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_finish -
                                    (long)(this->m_probabilities).
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start) >> 3) + -1);
  output(this);
  return;
}

Assistant:

void encodeFano() {
        calcProbabilities();
        m_matrix.resize(m_probabilities.size());
        quickSortProbability(0, (int) m_probabilities.size() - 1);
        algorithmFano(0, (int) m_probabilities.size() - 1);
        output();
    }